

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_function.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformFuncCall(Transformer *this,PGFuncCall *root)

{
  long lVar1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  PGList *pPVar3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var5;
  templated_unique_single_t tVar6;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> uVar7;
  pointer puVar8;
  pointer puVar9;
  templated_unique_single_t tVar10;
  templated_unique_single_t tVar11;
  size_type sVar12;
  bool bVar13;
  ExpressionType EVar14;
  char cVar15;
  int iVar16;
  Transformer *this_00;
  type pPVar17;
  pointer pWVar18;
  pointer pOVar19;
  reference pvVar20;
  iterator iVar21;
  type pWVar22;
  reference pvVar23;
  unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_> this_01;
  pointer pCVar24;
  unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_> uVar25;
  reference __b;
  type expr_00;
  pointer pOVar26;
  __uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
  _Var27;
  ParserException *pPVar28;
  InternalException *pIVar29;
  uint uVar30;
  ExpressionType type;
  long in_RDX;
  pointer *__ptr_1;
  pointer *__ptr_4;
  pointer puVar31;
  pointer *__ptr;
  pointer *__ptr_10;
  char *pcVar32;
  templated_unique_single_t function;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  ExpressionType win_fun_type;
  undefined7 uStack_197;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  filter_expr;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_188;
  templated_unique_single_t order_bys;
  templated_unique_single_t expr;
  bool local_139;
  string lowercase_name;
  string function_name;
  string schema;
  string catalog;
  pointer local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar1 = *(long *)(in_RDX + 8);
  catalog._M_dataplus._M_p = (pointer)&catalog.field_2;
  catalog._M_string_length = 0;
  catalog.field_2._M_local_buf[0] = '\0';
  schema._M_dataplus._M_p = (pointer)&schema.field_2;
  schema._M_string_length = 0;
  schema.field_2._M_local_buf[0] = '\0';
  function_name._M_dataplus._M_p = (pointer)&function_name.field_2;
  function_name._M_string_length = 0;
  function_name.field_2._M_local_buf[0] = '\0';
  iVar16 = *(int *)(lVar1 + 4);
  if (iVar16 == 1) {
    ::std::__cxx11::string::_M_replace((ulong)&catalog,0,(char *)0x0,0x1f09e61);
    ::std::__cxx11::string::_M_replace((ulong)&schema,0,(char *)schema._M_string_length,0x1f09e61);
    function.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         *(unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           *)&(*(__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
                 **)(lVar1 + 8))->
              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ;
    optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&function);
    sVar12 = function_name._M_string_length;
    pcVar32 = *(char **)((long)function.
                               super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                               .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                               _M_head_impl + 8);
    strlen(pcVar32);
    ::std::__cxx11::string::_M_replace((ulong)&function_name,0,(char *)sVar12,(ulong)pcVar32);
  }
  else if (iVar16 == 2) {
    ::std::__cxx11::string::_M_replace((ulong)&catalog,0,(char *)0x0,0x1f09e61);
    function.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         *(unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           *)&(*(__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
                 **)(lVar1 + 8))->
              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ;
    optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&function);
    sVar12 = schema._M_string_length;
    pcVar32 = *(char **)((long)function.
                               super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                               .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                               _M_head_impl + 8);
    strlen(pcVar32);
    ::std::__cxx11::string::_M_replace((ulong)&schema,0,(char *)sVar12,(ulong)pcVar32);
    function.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         *(unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           *)&(*(__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
                 **)(*(long *)(lVar1 + 8) + 8))->
              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ;
    optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&function);
    sVar12 = function_name._M_string_length;
    pcVar32 = *(char **)((long)function.
                               super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                               .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                               _M_head_impl + 8);
    strlen(pcVar32);
    ::std::__cxx11::string::_M_replace((ulong)&function_name,0,(char *)sVar12,(ulong)pcVar32);
  }
  else {
    if (iVar16 != 3) {
      pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
      function.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           )&local_1a8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&function,"TransformFuncCall - Expected 1, 2 or 3 qualifications","");
      ParserException::ParserException(pPVar28,(string *)&function);
      __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    function.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         *(unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           *)&(*(__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
                 **)(lVar1 + 8))->
              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ;
    optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&function);
    sVar12 = catalog._M_string_length;
    pcVar32 = *(char **)((long)function.
                               super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                               .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                               _M_head_impl + 8);
    strlen(pcVar32);
    ::std::__cxx11::string::_M_replace((ulong)&catalog,0,(char *)sVar12,(ulong)pcVar32);
    function.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         *(unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           *)&(*(__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
                 **)(*(long *)(lVar1 + 8) + 8))->
              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ;
    optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&function);
    sVar12 = schema._M_string_length;
    pcVar32 = *(char **)((long)function.
                               super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                               .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                               _M_head_impl + 8);
    strlen(pcVar32);
    ::std::__cxx11::string::_M_replace((ulong)&schema,0,(char *)sVar12,(ulong)pcVar32);
    function.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         *(unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           *)&(*(__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
                 **)(*(long *)(*(long *)(lVar1 + 8) + 8) + 8))->
              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ;
    optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&function);
    sVar12 = function_name._M_string_length;
    pcVar32 = *(char **)((long)function.
                               super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                               .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                               _M_head_impl + 8);
    strlen(pcVar32);
    ::std::__cxx11::string::_M_replace((ulong)&function_name,0,(char *)sVar12,(ulong)pcVar32);
  }
  local_188.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*(PGList **)(in_RDX + 0x10) != (PGList *)0x0) {
    TransformExpressionList
              ((Transformer *)root,*(PGList **)(in_RDX + 0x10),
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_188);
  }
  if ((long)local_188.
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_188.
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    this_00 = (Transformer *)
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                            *)&local_188,0);
    pPVar17 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)this_00);
    bVar13 = ExpressionIsEmptyStar(this_00,pPVar17);
    puVar9 = local_188.
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar8 = local_188.
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((((bVar13) && (*(char *)(in_RDX + 0x2b) == '\0')) && (*(long *)(in_RDX + 0x18) == 0)) &&
       (puVar31 = local_188.
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       local_188.
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish !=
       local_188.
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start)) {
      do {
        _Var2._M_head_impl =
             (puVar31->
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        if (_Var2._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
        }
        (puVar31->
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)0x0;
        puVar31 = puVar31 + 1;
      } while (puVar31 != puVar9);
      local_188.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar8;
    }
  }
  StringUtil::Lower((string *)&lowercase_name,(string *)&function_name);
  if (*(long *)(in_RDX + 0x38) != 0) {
    bVar13 = InWindowDefinition((Transformer *)root);
    if (bVar13) {
      pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
      function.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           )&local_1a8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&function,"window functions are not allowed in window definitions","");
      ParserException::ParserException(pPVar28,(string *)&function);
      __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    EVar14 = WindowExpression::WindowToExpressionType(&lowercase_name);
    win_fun_type = EVar14;
    if (EVar14 != WINDOW_AGGREGATE) {
      if (EVar14 == INVALID) {
        pIVar29 = (InternalException *)__cxa_allocate_exception(0x10);
        function.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              )&local_1a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&function,"Unknown/unsupported window function","");
        InternalException::InternalException(pIVar29,(string *)&function);
        __cxa_throw(pIVar29,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (*(char *)(in_RDX + 0x2b) == '\x01') {
        pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
        function.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              )&local_1a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&function,
                   "DISTINCT is not implemented for non-aggregate window functions!","");
        ParserException::ParserException(pPVar28,(string *)&function);
        __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    if (*(long *)(in_RDX + 0x18) != 0) {
      uVar30 = EVar14 - 0x6e;
      if (0x18 < uVar30) {
LAB_00e9162b:
        pIVar29 = (InternalException *)__cxa_allocate_exception(0x10);
        function.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              )&local_1a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&function,"Unknown orderable window type %s","");
        ExpressionTypeToString_abi_cxx11_((string *)&expr,(duckdb *)(ulong)EVar14,type);
        InternalException::InternalException<char_const*>
                  (pIVar29,(string *)&function,
                   (char *)expr.
                           super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
                           .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl);
        __cxa_throw(pIVar29,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((0x1f0f401U >> (uVar30 & 0x1f) & 1) == 0) {
        if (uVar30 == 0xb) {
          pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
          function.
          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                )&local_1a8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&function,"ORDER BY is not supported for the window function \"%s\"",
                     "");
          ParserException::ParserException<char_const*>
                    (pPVar28,(string *)&function,lowercase_name._M_dataplus._M_p);
          __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        goto LAB_00e9162b;
      }
    }
    if ((EVar14 != WINDOW_AGGREGATE) && (*(long *)(in_RDX + 0x20) != 0)) {
      pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
      function.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           )&local_1a8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&function,"FILTER is not implemented for non-aggregate window functions!"
                 ,"");
      ParserException::ParserException(pPVar28,(string *)&function);
      __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (*(char *)(in_RDX + 0x28) == '\x01') {
      pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
      function.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           )&local_1a8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&function,"EXPORT_STATE is not supported for window functions!","");
      ParserException::ParserException(pPVar28,(string *)&function);
      __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((EVar14 == WINDOW_AGGREGATE) && (*(int *)(in_RDX + 0x2c) != 0)) {
      pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
      function.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           )&local_1a8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&function,"RESPECT/IGNORE NULLS is not supported for windowed aggregates"
                 ,"");
      ParserException::ParserException(pPVar28,(string *)&function);
      __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    make_uniq<duckdb::WindowExpression,duckdb::ExpressionType_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&>
              ((duckdb *)&expr,&win_fun_type,&catalog,&schema,&lowercase_name);
    iVar16 = *(int *)(in_RDX + 0x2c);
    pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
              ::operator->(&expr);
    pWVar18->ignore_nulls = iVar16 == 2;
    bVar13 = *(bool *)(in_RDX + 0x2b);
    pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
              ::operator->(&expr);
    pWVar18->distinct = bVar13;
    if (*(long *)(in_RDX + 0x20) != 0) {
      TransformExpression((Transformer *)&function,
                          (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
      pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                ::operator->(&expr);
      tVar6 = function;
      function.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           )(__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
             )0x0;
      _Var2._M_head_impl =
           (pWVar18->filter_expr).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pWVar18->filter_expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)
           tVar6.
           super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
           .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl;
      if (_Var2._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
      }
      if (function.
          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)function.
                              super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                              .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                              _M_head_impl + 8))();
      }
    }
    pPVar3 = *(PGList **)(in_RDX + 0x18);
    if (pPVar3 != (PGList *)0x0) {
      function.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           )operator_new(0x28);
      *(undefined1 *)
       ((long)function.
              super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
              .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl + 8) = 2;
      *(undefined ***)
       function.
       super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
       .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           &PTR__OrderModifier_0247f070;
      *(undefined8 *)
       ((long)function.
              super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
              .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl + 0x10) = 0;
      *(undefined8 *)
       ((long)function.
              super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
              .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl + 0x18) = 0;
      *(undefined8 *)
       ((long)function.
              super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
              .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl + 0x20) = 0;
      pOVar19 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                              *)&function);
      TransformOrderBy((Transformer *)root,pPVar3,&pOVar19->orders);
      unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
      operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                  *)&function);
      pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                ::operator->(&expr);
      ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::_M_move_assign
                (&(pWVar18->arg_orders).
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>);
      if (function.
          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)function.
                              super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                              .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                              _M_head_impl + 8))();
      }
    }
    if (win_fun_type == WINDOW_AGGREGATE) {
      pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                ::operator->(&expr);
      function.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           )(pWVar18->children).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      local_1a8._M_allocated_capacity =
           (size_type)
           (pWVar18->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pWVar18->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_188.
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pWVar18->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_188.
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (pWVar18->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_188.
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_188.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)&function);
    }
    else {
      if (local_188.
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_188.
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                  ::operator->(&expr);
        pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                *)&local_188,0);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pWVar18->children,pvVar20);
      }
      if ((win_fun_type & 0xfe) == WINDOW_LEAD) {
        if (8 < (ulong)((long)local_188.
                              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_188.
                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)) {
          pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                  *)&local_188,1);
          pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                    ::operator->(&expr);
          _Var2._M_head_impl =
               (pvVar20->
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (pvVar20->
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (ParsedExpression *)0x0;
          _Var4._M_head_impl =
               (pWVar18->offset_expr).
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (pWVar18->offset_expr).
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               _Var2._M_head_impl;
          if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
            (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
          }
        }
        if (0x10 < (ulong)((long)local_188.
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_188.
                                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                  *)&local_188,2);
          pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                    ::operator->(&expr);
          _Var2._M_head_impl =
               (pvVar20->
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (pvVar20->
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (ParsedExpression *)0x0;
          _Var4._M_head_impl =
               (pWVar18->default_expr).
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (pWVar18->default_expr).
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               _Var2._M_head_impl;
          if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
            (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
          }
        }
        if (0x18 < (ulong)((long)local_188.
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_188.
                                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
          function.
          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                )&local_1a8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&function,"Incorrect number of parameters for function %s","");
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,lowercase_name._M_dataplus._M_p,
                     lowercase_name._M_dataplus._M_p + lowercase_name._M_string_length);
          ParserException::ParserException<std::__cxx11::string>
                    (pPVar28,(string *)&function,&local_50);
          __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else if (win_fun_type == WINDOW_NTH_VALUE) {
        if (8 < (ulong)((long)local_188.
                              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_188.
                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)) {
          pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                    ::operator->(&expr);
          pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                  *)&local_188,1);
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&pWVar18->children,pvVar20);
        }
        if (0x10 < (ulong)((long)local_188.
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_188.
                                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
          function.
          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                )&local_1a8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&function,"Incorrect number of parameters for function %s","");
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,lowercase_name._M_dataplus._M_p,
                     lowercase_name._M_dataplus._M_p + lowercase_name._M_string_length);
          ParserException::ParserException<std::__cxx11::string>
                    (pPVar28,(string *)&function,&local_70);
          __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else if (8 < (ulong)((long)local_188.
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_188.
                                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
        pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
        function.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              )&local_1a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&function,"Incorrect number of parameters for function %s","");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,lowercase_name._M_dataplus._M_p,
                   lowercase_name._M_dataplus._M_p + lowercase_name._M_string_length);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar28,(string *)&function,&local_90);
        __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    filter_expr.
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> *)
          &((__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
             *)(in_RDX + 0x38))->
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ;
    optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGWindowDef,_true> *)&filter_expr);
    if (*(long *)((long)filter_expr.
                        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 8)
        != 0) {
      optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGWindowDef,_true> *)&filter_expr);
      ::std::__cxx11::string::string
                ((string *)&function,
                 *(char **)((long)filter_expr.
                                  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                  _M_head_impl + 8),(allocator *)&order_bys);
      iVar21 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&root[1].args,(key_type *)&function);
      if (function.
          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
          (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
          &local_1a8) {
        operator_delete((void *)function.
                                super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                                .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                                _M_head_impl);
      }
      if (iVar21.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_true>
          ._M_cur == (__node_type *)0x0) {
        pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
        function.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              )(unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                )&local_1a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&function,"window \"%s\" does not exist","");
        optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGWindowDef,_true> *)&filter_expr);
        ParserException::ParserException<char*>
                  (pPVar28,(string *)&function,
                   *(char **)((long)filter_expr.
                                    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                    _M_head_impl + 8));
        __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      filter_expr.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> *)
            &((__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
               *)((long)iVar21.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_true>
                        ._M_cur + 0x28))->
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ;
    }
    order_bys.super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
    _M_t.super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
    super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl =
         (unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>)
         (unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>)
         filter_expr.
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGWindowDef,_true> *)&order_bys);
    pcVar32 = *(char **)((long)order_bys.
                               super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
                               .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl +
                        0x10);
    optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGWindowDef,_true> *)&order_bys);
    if (*(long *)((long)order_bys.
                        super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
                        .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl + 0x10)
        != 0) {
      optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGWindowDef,_true> *)&filter_expr);
      ::std::__cxx11::string::string
                ((string *)&function,
                 *(char **)((long)filter_expr.
                                  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                  _M_head_impl + 0x10),(allocator *)&local_b8);
      iVar21 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&root[1].args,(key_type *)&function);
      if (function.
          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
          (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
          &local_1a8) {
        operator_delete((void *)function.
                                super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                                .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                                _M_head_impl);
      }
      if (iVar21.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_true>
          ._M_cur == (__node_type *)0x0) {
        pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
        function.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              )(unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                )&local_1a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&function,"window \"%s\" does not exist","");
        optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGWindowDef,_true> *)&filter_expr);
        ParserException::ParserException<char*>
                  (pPVar28,(string *)&function,
                   *(char **)((long)filter_expr.
                                    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                    _M_head_impl + 0x10));
        __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      order_bys.super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
      super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl =
           *(unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_> *)
            &((__uniq_ptr_data<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true,_true>
               *)((long)iVar21.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_true>
                        ._M_cur + 0x28))->
             super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
      ;
      optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGWindowDef,_true> *)&order_bys);
      if (((*(long *)((long)order_bys.
                            super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
                            .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl +
                     0x30) != 0) ||
          (optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid
                     ((optional_ptr<duckdb_libpgquery::PGWindowDef,_true> *)&order_bys),
          *(long *)((long)order_bys.
                          super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
                          .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl + 0x38
                   ) != 0)) ||
         (optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid
                    ((optional_ptr<duckdb_libpgquery::PGWindowDef,_true> *)&order_bys),
         *(int *)((long)order_bys.
                        super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
                        .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl + 0x28)
         != 0x422)) {
        pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
        function.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              )(unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                )&local_1a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&function,"cannot copy window \"%s\" because it has a frame clause","")
        ;
        optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGWindowDef,_true> *)&filter_expr);
        ParserException::ParserException<char*>
                  (pPVar28,(string *)&function,
                   *(char **)((long)filter_expr.
                                    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                    _M_head_impl + 0x10));
        __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    root[2].func_variadic = true;
    optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGWindowDef,_true> *)&order_bys);
    tVar10 = order_bys;
    pWVar22 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
              ::operator*(&expr);
    TransformWindowDef((Transformer *)root,
                       (PGWindowDef *)
                       tVar10.
                       super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
                       .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl,pWVar22,
                       (char *)0x0);
    if (order_bys.
        super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
        super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
        .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl !=
        (unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>)
        filter_expr.
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl) {
      optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGWindowDef,_true> *)&filter_expr);
      uVar7 = filter_expr;
      pWVar22 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                ::operator*(&expr);
      TransformWindowDef((Transformer *)root,
                         (PGWindowDef *)
                         uVar7.
                         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl,
                         pWVar22,pcVar32);
    }
    optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGWindowDef,_true> *)&filter_expr);
    uVar7 = filter_expr;
    pWVar22 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
              ::operator*(&expr);
    TransformWindowFrame
              ((Transformer *)root,
               (PGWindowDef *)
               uVar7.
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl,pWVar22);
    root[2].func_variadic = false;
    pWVar22 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
              ::operator*(&expr);
    SetQueryLocation(&pWVar22->super_ParsedExpression,*(int *)(in_RDX + 0x40));
    tVar11 = expr;
    expr.super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
    .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>)
         (__uniq_ptr_data<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true,_true>
          )0x0;
    (this->parent).ptr =
         (Transformer *)
         tVar11.
         super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
         .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl;
    goto LAB_00e90e36;
  }
  if (*(int *)(in_RDX + 0x2c) != 0) {
    pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
    function.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
         &local_1a8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&function,"RESPECT/IGNORE NULLS is not supported for non-window functions",
               "");
    ParserException::ParserException(pPVar28,(string *)&function);
    __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  filter_expr.
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  if (*(long *)(in_RDX + 0x20) != 0) {
    TransformExpression((Transformer *)&function,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    uVar7 = filter_expr;
    filter_expr.
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         function;
    function.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
         (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
          )0x0;
    if (uVar7.
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)uVar7.
                            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl +
                  8))();
    }
    if (function.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)function.
                            super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                            .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl
                  + 8))();
    }
  }
  order_bys.super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
  _M_t.super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
  _M_t.super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
  super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl =
       (unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>)
       operator_new(0x28);
  *(undefined1 *)
   ((long)order_bys.
          super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
          super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
          .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl + 8) = 2;
  *(undefined ***)
   order_bys.super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
   _M_t.super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
   _M_t.super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
   .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl =
       &PTR__OrderModifier_0247f070;
  *(undefined8 *)
   ((long)order_bys.
          super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
          super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
          .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)order_bys.
          super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
          super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
          .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined8 *)
   ((long)order_bys.
          super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
          super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
          .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl + 0x20) = 0;
  pPVar3 = *(PGList **)(in_RDX + 0x18);
  pOVar19 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
            operator->(&order_bys);
  TransformOrderBy((Transformer *)root,pPVar3,&pOVar19->orders);
  if (*(char *)(in_RDX + 0x29) == '\x01') {
    pOVar19 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
              operator->(&order_bys);
    if ((long)(pOVar19->orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pOVar19->orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_start != 0x10) {
      pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
      function.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           )&local_1a8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&function,"Cannot use multiple ORDER BY clauses with WITHIN GROUP","");
      ParserException::ParserException(pPVar28,(string *)&function);
      __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar16 = ::std::__cxx11::string::compare((char *)&lowercase_name);
    if (iVar16 == 0) {
      if ((long)local_188.
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_188.
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 8) {
        pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
        function.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              )&local_1a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&function,"Wrong number of arguments for PERCENTILE_CONT","");
        ParserException::ParserException(pPVar28,(string *)&function);
        __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pcVar32 = "quantile_cont";
    }
    else {
      iVar16 = ::std::__cxx11::string::compare((char *)&lowercase_name);
      if (iVar16 == 0) {
        if ((long)local_188.
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_188.
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 8) {
          pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
          function.
          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                )&local_1a8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&function,"Wrong number of arguments for PERCENTILE_DISC","");
          ParserException::ParserException(pPVar28,(string *)&function);
          __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pcVar32 = "quantile_disc";
      }
      else {
        pcVar32 = "mode";
        iVar16 = ::std::__cxx11::string::compare((char *)&lowercase_name);
        if (iVar16 != 0) {
          pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
          function.
          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                )&local_1a8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&function,"Unknown ordered aggregate \"%s\".","");
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,function_name._M_dataplus._M_p,
                     function_name._M_dataplus._M_p + function_name._M_string_length);
          ParserException::ParserException<std::__cxx11::string>
                    (pPVar28,(string *)&function,&local_b0);
          __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (local_188.
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_188.
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
          function.
          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                )&local_1a8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&function,"Wrong number of arguments for MODE","");
          ParserException::ParserException(pPVar28,(string *)&function);
          __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    }
    ::std::__cxx11::string::_M_replace
              ((ulong)&lowercase_name,0,(char *)lowercase_name._M_string_length,(ulong)pcVar32);
  }
  iVar16 = ::std::__cxx11::string::compare((char *)&lowercase_name);
  if ((iVar16 == 0) &&
     (local_188.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_188.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    ::std::__cxx11::string::_M_replace
              ((ulong)&lowercase_name,0,(char *)lowercase_name._M_string_length,0x1dc38b5);
  }
  iVar16 = ::std::__cxx11::string::compare((char *)&lowercase_name);
  if (iVar16 == 0) {
    if ((long)local_188.
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_188.
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x18) {
      pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
      function.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           )&local_1a8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&function,"Wrong number of arguments to IF.","");
      ParserException::ParserException(pPVar28,(string *)&function);
      __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_01._M_t.
    super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
    .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true,_true>
          )operator_new(0x58);
    CaseExpression::CaseExpression
              ((CaseExpression *)
               this_01._M_t.
               super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
               .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl);
    function.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
         (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
          )0x0;
    expr.super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
    .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>)
         (unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>)
         this_01._M_t.
         super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
         .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl;
    pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                            *)&local_188,0);
    _Var2._M_head_impl =
         (pvVar20->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pvVar20->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (function.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
         )0x0) {
      lVar1 = *(long *)function.
                       super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                       .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl;
      function.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           )(unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
             )_Var2._M_head_impl;
      (**(code **)(lVar1 + 8))();
      _Var2._M_head_impl =
           (ParsedExpression *)
           function.
           super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
           .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl;
    }
    function.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
         _Var2._M_head_impl;
    pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                            *)&local_188,1);
    _Var2._M_head_impl =
         (pvVar20->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pvVar20->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    pCVar24 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
              ::operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                            *)&expr);
    ::std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>::
    emplace_back<duckdb::CaseCheck>
              (&(pCVar24->case_checks).
                super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>,
               (CaseCheck *)&function);
    pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                            *)&local_188,2);
    pCVar24 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
              ::operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                            *)&expr);
    _Var4._M_head_impl =
         (pvVar20->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pvVar20->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    _Var5._M_head_impl =
         (pCVar24->else_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar24->else_expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var4._M_head_impl;
    if (_Var5._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
    }
    tVar11.
    super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
    .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl =
         expr.
         super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
         .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl;
    expr.super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
    .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>)
         (__uniq_ptr_data<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true,_true>
          )0x0;
    (this->parent).ptr =
         (Transformer *)
         tVar11.
         super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
         .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl;
    if (_Var2._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
    }
    if (function.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)function.
                            super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                            .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl
                  + 8))();
    }
    if (expr.
        super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
        .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)expr.
                            super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
                            .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl +
                  8))();
    }
  }
  else {
    iVar16 = ::std::__cxx11::string::compare((char *)&lowercase_name);
    if (iVar16 == 0) {
      if ((long)local_188.
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_188.
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 8) {
        pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
        function.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              )&local_1a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&function,"Wrong number of arguments to the UNPACK operator","");
        ParserException::ParserException(pPVar28,(string *)&function);
        __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar25._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
            )operator_new(0x50);
      function.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           )(__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
             )0x0;
      expr.
      super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
      .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>)
           (__uniq_ptr_data<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true,_true>
            )0x0;
      OperatorExpression::OperatorExpression
                ((OperatorExpression *)
                 uVar25._M_t.
                 super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                 .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl,
                 OPERATOR_UNPACK,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&function,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&expr);
      _win_fun_type =
           (FunctionExpression *)
           uVar25._M_t.
           super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
           .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl;
      if (expr.
          super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
          .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)expr.
                              super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
                              .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl
                    + 8))();
      }
      expr.
      super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
      .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>)
           (__uniq_ptr_data<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true,_true>
            )0x0;
      if (function.
          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)function.
                              super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                              .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                              _M_head_impl + 8))();
      }
      pOVar26 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                              *)&win_fun_type);
LAB_00e90c30:
      function.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           )(pOVar26->children).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      local_1a8._M_allocated_capacity =
           (size_type)
           (pOVar26->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pOVar26->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_188.
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pOVar26->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_188.
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (pOVar26->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_188.
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_188.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)&function);
      _Var27._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (tuple<duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>)
           (tuple<duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>)
           _win_fun_type;
      _win_fun_type = (FunctionExpression *)0x0;
    }
    else {
      iVar16 = ::std::__cxx11::string::compare((char *)&lowercase_name);
      if (iVar16 == 0) {
        if ((long)local_188.
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_188.
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 8) {
          pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
          function.
          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                )&local_1a8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&function,"Wrong number of arguments provided to TRY expression","");
          ParserException::ParserException(pPVar28,(string *)&function);
          __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        uVar25._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
             (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
              )operator_new(0x50);
        function.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              )(__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
                )0x0;
        expr.
        super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
        .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>)
             (__uniq_ptr_data<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true,_true>
              )0x0;
        OperatorExpression::OperatorExpression
                  ((OperatorExpression *)
                   uVar25._M_t.
                   super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                   .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl,
                   OPERATOR_TRY,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&function,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&expr);
        _win_fun_type =
             (FunctionExpression *)
             uVar25._M_t.
             super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
             .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl;
        if (expr.
            super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
            .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)expr.
                                super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
                                .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>.
                                _M_head_impl + 8))();
        }
        expr.
        super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
        .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>)
             (__uniq_ptr_data<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true,_true>
              )0x0;
        if (function.
            super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
            .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)function.
                                super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                                .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                                _M_head_impl + 8))();
        }
        pOVar26 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                  ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                                *)&win_fun_type);
        goto LAB_00e90c30;
      }
      iVar16 = ::std::__cxx11::string::compare((char *)&lowercase_name);
      if (iVar16 == 0) {
        uVar25._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
             (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
              )operator_new(0x50);
        function.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              )(__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
                )0x0;
        expr.
        super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
        .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>)
             (__uniq_ptr_data<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true,_true>
              )0x0;
        OperatorExpression::OperatorExpression
                  ((OperatorExpression *)
                   uVar25._M_t.
                   super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                   .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl,
                   ARRAY_CONSTRUCTOR,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&function,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&expr);
        _win_fun_type =
             (FunctionExpression *)
             uVar25._M_t.
             super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
             .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl;
        if (expr.
            super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
            .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)expr.
                                super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
                                .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>.
                                _M_head_impl + 8))();
        }
        expr.
        super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
        .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>)
             (__uniq_ptr_data<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true,_true>
              )0x0;
        if (function.
            super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
            .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)function.
                                super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                                .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                                _M_head_impl + 8))();
        }
        pOVar26 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                  ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                                *)&win_fun_type);
        goto LAB_00e90c30;
      }
      iVar16 = ::std::__cxx11::string::compare((char *)&lowercase_name);
      if (iVar16 == 0) {
        if ((long)local_188.
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_188.
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x10) {
          pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
          function.
          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                )&local_1a8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&function,
                     "Wrong number of arguments to __internal_position_operator.","");
          ParserException::ParserException(pPVar28,(string *)&function);
          __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                *)&local_188,0);
        __b = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                            *)&local_188,1);
        ::std::
        swap<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  (pvVar20,__b);
        ::std::__cxx11::string::operator=((string *)&lowercase_name,"position");
LAB_00e90cf4:
        expr.
        super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
        .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>)
             (unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>)
             lowercase_name._M_dataplus._M_p;
        _win_fun_type = _win_fun_type & 0xffffffffffffff00;
        make_uniq<duckdb::FunctionExpression,std::__cxx11::string,std::__cxx11::string,char_const*,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::OrderModifier,std::default_delete<duckdb::OrderModifier>,true>,bool&,bool,bool&>
                  ((duckdb *)&function,&catalog,&schema,(char **)&expr,
                   (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    *)&local_188,&filter_expr,&order_bys,(bool *)(in_RDX + 0x2b),
                   (bool *)&win_fun_type,(bool *)(in_RDX + 0x28));
        expr_00 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                  ::operator*(&function);
        SetQueryLocation(&expr_00->super_ParsedExpression,*(int *)(in_RDX + 0x40));
      }
      else {
        iVar16 = ::std::__cxx11::string::compare((char *)&lowercase_name);
        if (iVar16 != 0) {
          iVar16 = ::std::__cxx11::string::compare((char *)&lowercase_name);
          if ((iVar16 == 0) &&
             (pOVar19 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                        ::operator->(&order_bys),
             (long)(pOVar19->orders).
                   super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                   super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pOVar19->orders).
                   super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                   super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                   _M_impl.super__Vector_impl_data._M_start == 0x10)) {
            if ((long)local_188.
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_188.
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != 8) {
              pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
              function.
              super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
              .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
                   (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                    )&local_1a8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&function,"Wrong number of arguments to LIST.","");
              ParserException::ParserException(pPVar28,(string *)&function);
              __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
            }
            pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                    *)&local_188,0);
            _Var2._M_head_impl =
                 (pvVar20->
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            pOVar19 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                      ::operator->(&order_bys);
            pvVar23 = vector<duckdb::OrderByNode,_true>::operator[](&pOVar19->orders,0);
            pPVar17 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*(&pvVar23->expression);
            cVar15 = (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 0x50))
                               (_Var2._M_head_impl,pPVar17);
            if (cVar15 != '\0') {
              expr.
              super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
              .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl =
                   (unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
                    )EnumUtil::ToChars<duckdb::OrderType>(pvVar23->type);
              make_uniq<duckdb::ConstantExpression,char_const*>((duckdb *)&function,(char **)&expr);
              _win_fun_type =
                   (FunctionExpression *)
                   EnumUtil::ToChars<duckdb::OrderByNullType>(pvVar23->null_order);
              make_uniq<duckdb::ConstantExpression,char_const*>
                        ((duckdb *)&expr,(char **)&win_fun_type);
              tVar10 = order_bys;
              order_bys.
              super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
              _M_t.
              super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
              .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl =
                   (unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>)
                   (__uniq_ptr_data<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true,_true>
                    )0x0;
              if (tVar10.
                  super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
                  .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl !=
                  (__uniq_ptr_data<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true,_true>
                   )0x0) {
                (**(code **)(*(long *)tVar10.
                                      super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                                      ._M_t.
                                      super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
                                      .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>.
                                      _M_head_impl + 8))();
              }
              local_b8 = lowercase_name._M_dataplus._M_p;
              local_139 = false;
              make_uniq<duckdb::FunctionExpression,std::__cxx11::string&,std::__cxx11::string&,char_const*,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::OrderModifier,std::default_delete<duckdb::OrderModifier>,true>,bool&,bool,bool&>
                        ((duckdb *)&win_fun_type,&catalog,&schema,&local_b8,
                         (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                          *)&local_188,&filter_expr,&order_bys,(bool *)(in_RDX + 0x2b),&local_139,
                         (bool *)(in_RDX + 0x28));
              ::std::__cxx11::string::operator=((string *)&lowercase_name,"list_sort");
              tVar10 = order_bys;
              order_bys.
              super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
              _M_t.
              super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
              .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl =
                   (unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>)
                   (__uniq_ptr_data<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true,_true>
                    )0x0;
              if (tVar10.
                  super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
                  .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl !=
                  (__uniq_ptr_data<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true,_true>
                   )0x0) {
                (**(code **)(*(long *)tVar10.
                                      super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                                      ._M_t.
                                      super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
                                      .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>.
                                      _M_head_impl + 8))();
              }
              uVar7.
              super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                   filter_expr.
                   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
              filter_expr.
              super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                    )(__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
                      )0x0;
              if (uVar7.
                  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
                  (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
                   )0x0) {
                (**(code **)(*(long *)uVar7.
                                      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                      ._M_t.
                                      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                      _M_head_impl + 8))();
              }
              puVar9 = local_188.
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              puVar8 = local_188.
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar31 = local_188.
                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_188.
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_188.
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                do {
                  _Var2._M_head_impl =
                       (puVar31->
                       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
                  if (_Var2._M_head_impl != (ParsedExpression *)0x0) {
                    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
                  }
                  (puVar31->
                  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                       (ParsedExpression *)0x0;
                  puVar31 = puVar31 + 1;
                } while (puVar31 != puVar9);
                local_188.
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = puVar8;
              }
              *(bool *)(in_RDX + 0x2b) = false;
              ::std::
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::FunctionExpression,std::default_delete<duckdb::FunctionExpression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                          *)&local_188,
                         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                          *)&win_fun_type);
              ::std::
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                          *)&local_188,
                         (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                          *)&function);
              ::std::
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                          *)&local_188,
                         (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                          *)&expr);
              if (_win_fun_type != (FunctionExpression *)0x0) {
                (**(code **)(*(long *)_win_fun_type + 8))();
              }
              if (expr.
                  super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
                  .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl !=
                  (__uniq_ptr_data<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true,_true>
                   )0x0) {
                (**(code **)(*(long *)expr.
                                      super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
                                      ._M_t.
                                      super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
                                      .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>.
                                      _M_head_impl + 8))();
              }
              if (function.
                  super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                  .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
                  (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
                   )0x0) {
                (**(code **)(*(long *)function.
                                      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                                      ._M_t.
                                      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                                      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                                      _M_head_impl + 8))();
              }
            }
          }
          else {
            iVar16 = ::std::__cxx11::string::compare((char *)&lowercase_name);
            if (iVar16 == 0) {
              if ((long)local_188.
                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_188.
                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != 8) {
                pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
                function.
                super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
                     (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                      )&local_1a8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&function,"Wrong number of arguments provided to DATE function"
                           ,"");
                ParserException::ParserException(pPVar28,(string *)&function);
                __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                        ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                      *)&local_188,0);
              make_uniq<duckdb::CastExpression,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                        ((duckdb *)&function,&LogicalType::DATE,pvVar20);
              goto LAB_00e90e02;
            }
          }
          goto LAB_00e90cf4;
        }
        if ((long)local_188.
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_188.
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x10) {
          pPVar28 = (ParserException *)__cxa_allocate_exception(0x10);
          function.
          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                )&local_1a8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&function,"Wrong number of arguments to IFNULL.","");
          ParserException::ParserException(pPVar28,(string *)&function);
          __cxa_throw(pPVar28,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        expr.
        super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
        .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl._0_1_ = 0x98;
        make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType>
                  ((duckdb *)&function,(ExpressionType *)&expr);
        pOVar26 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                  ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                                *)&function);
        pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                *)&local_188,0);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pOVar26->children,pvVar20);
        pOVar26 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                  ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                                *)&function);
        pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                *)&local_188,1);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pOVar26->children,pvVar20);
      }
LAB_00e90e02:
      _Var27._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (tuple<duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>)
           (tuple<duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>)
           function.
           super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
           .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl;
      function.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           )(__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
             )0x0;
    }
    (this->parent).ptr =
         (Transformer *)
         _Var27._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
         .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl;
  }
  if (order_bys.super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
      super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)order_bys.
                          super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
                          .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl + 8))
              ();
  }
  if (filter_expr.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)filter_expr.
                          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 8
                ))();
  }
LAB_00e90e36:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lowercase_name._M_dataplus._M_p != &lowercase_name.field_2) {
    operator_delete(lowercase_name._M_dataplus._M_p);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)function_name._M_dataplus._M_p != &function_name.field_2) {
    operator_delete(function_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)schema._M_dataplus._M_p != &schema.field_2) {
    operator_delete(schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)catalog._M_dataplus._M_p != &catalog.field_2) {
    operator_delete(catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformFuncCall(duckdb_libpgquery::PGFuncCall &root) {
	auto name = root.funcname;
	string catalog, schema, function_name;
	if (name->length == 3) {
		// catalog + schema + name
		catalog = PGPointerCast<duckdb_libpgquery::PGValue>(name->head->data.ptr_value)->val.str;
		schema = PGPointerCast<duckdb_libpgquery::PGValue>(name->head->next->data.ptr_value)->val.str;
		function_name = PGPointerCast<duckdb_libpgquery::PGValue>(name->head->next->next->data.ptr_value)->val.str;
	} else if (name->length == 2) {
		// schema + name
		catalog = INVALID_CATALOG;
		schema = PGPointerCast<duckdb_libpgquery::PGValue>(name->head->data.ptr_value)->val.str;
		function_name = PGPointerCast<duckdb_libpgquery::PGValue>(name->head->next->data.ptr_value)->val.str;
	} else if (name->length == 1) {
		// unqualified name
		catalog = INVALID_CATALOG;
		schema = INVALID_SCHEMA;
		function_name = PGPointerCast<duckdb_libpgquery::PGValue>(name->head->data.ptr_value)->val.str;
	} else {
		throw ParserException("TransformFuncCall - Expected 1, 2 or 3 qualifications");
	}

	//  transform children
	vector<unique_ptr<ParsedExpression>> children;
	if (root.args) {
		TransformExpressionList(*root.args, children);
	}
	if (children.size() == 1 && ExpressionIsEmptyStar(*children[0]) && !root.agg_distinct && !root.agg_order) {
		// COUNT(*) gets translated into COUNT()
		children.clear();
	}

	auto lowercase_name = StringUtil::Lower(function_name);
	if (root.over) {
		if (InWindowDefinition()) {
			throw ParserException("window functions are not allowed in window definitions");
		}

		const auto win_fun_type = WindowExpression::WindowToExpressionType(lowercase_name);
		if (win_fun_type == ExpressionType::INVALID) {
			throw InternalException("Unknown/unsupported window function");
		}

		if (win_fun_type != ExpressionType::WINDOW_AGGREGATE && root.agg_distinct) {
			throw ParserException("DISTINCT is not implemented for non-aggregate window functions!");
		}

		if (root.agg_order && !IsOrderableWindowFunction(win_fun_type)) {
			throw ParserException("ORDER BY is not supported for the window function \"%s\"", lowercase_name.c_str());
		}

		if (win_fun_type != ExpressionType::WINDOW_AGGREGATE && root.agg_filter) {
			throw ParserException("FILTER is not implemented for non-aggregate window functions!");
		}
		if (root.export_state) {
			throw ParserException("EXPORT_STATE is not supported for window functions!");
		}

		if (win_fun_type == ExpressionType::WINDOW_AGGREGATE &&
		    root.agg_ignore_nulls != duckdb_libpgquery::PG_DEFAULT_NULLS) {
			throw ParserException("RESPECT/IGNORE NULLS is not supported for windowed aggregates");
		}

		auto expr = make_uniq<WindowExpression>(win_fun_type, std::move(catalog), std::move(schema), lowercase_name);
		expr->ignore_nulls = (root.agg_ignore_nulls == duckdb_libpgquery::PG_IGNORE_NULLS);
		expr->distinct = root.agg_distinct;

		if (root.agg_filter) {
			auto filter_expr = TransformExpression(root.agg_filter);
			expr->filter_expr = std::move(filter_expr);
		}

		if (root.agg_order) {
			auto order_bys = make_uniq<OrderModifier>();
			TransformOrderBy(root.agg_order, order_bys->orders);
			expr->arg_orders = std::move(order_bys->orders);
		}

		if (win_fun_type == ExpressionType::WINDOW_AGGREGATE) {
			expr->children = std::move(children);
		} else {
			if (!children.empty()) {
				expr->children.push_back(std::move(children[0]));
			}
			if (win_fun_type == ExpressionType::WINDOW_LEAD || win_fun_type == ExpressionType::WINDOW_LAG) {
				if (children.size() > 1) {
					expr->offset_expr = std::move(children[1]);
				}
				if (children.size() > 2) {
					expr->default_expr = std::move(children[2]);
				}
				if (children.size() > 3) {
					throw ParserException("Incorrect number of parameters for function %s", lowercase_name);
				}
			} else if (win_fun_type == ExpressionType::WINDOW_NTH_VALUE) {
				if (children.size() > 1) {
					expr->children.push_back(std::move(children[1]));
				}
				if (children.size() > 2) {
					throw ParserException("Incorrect number of parameters for function %s", lowercase_name);
				}
			} else {
				if (children.size() > 1) {
					throw ParserException("Incorrect number of parameters for function %s", lowercase_name);
				}
			}
		}
		auto window_spec = PGPointerCast<duckdb_libpgquery::PGWindowDef>(root.over);
		if (window_spec->name) {
			auto it = window_clauses.find(string(window_spec->name));
			if (it == window_clauses.end()) {
				throw ParserException("window \"%s\" does not exist", window_spec->name);
			}
			window_spec = it->second;
			D_ASSERT(window_spec);
		}
		auto window_ref = window_spec;
		auto window_name = window_ref->refname;
		if (window_ref->refname) {
			auto it = window_clauses.find(string(window_spec->refname));
			if (it == window_clauses.end()) {
				throw ParserException("window \"%s\" does not exist", window_spec->refname);
			}
			window_ref = it->second;
			D_ASSERT(window_ref);
			if (window_ref->startOffset || window_ref->endOffset || window_ref->frameOptions != FRAMEOPTION_DEFAULTS) {
				throw ParserException("cannot copy window \"%s\" because it has a frame clause", window_spec->refname);
			}
		}
		in_window_definition = true;
		TransformWindowDef(*window_ref, *expr);
		if (window_ref != window_spec) {
			TransformWindowDef(*window_spec, *expr, window_name);
		}
		TransformWindowFrame(*window_spec, *expr);
		in_window_definition = false;
		SetQueryLocation(*expr, root.location);
		return std::move(expr);
	}

	if (root.agg_ignore_nulls != duckdb_libpgquery::PG_DEFAULT_NULLS) {
		throw ParserException("RESPECT/IGNORE NULLS is not supported for non-window functions");
	}

	unique_ptr<ParsedExpression> filter_expr;
	if (root.agg_filter) {
		filter_expr = TransformExpression(root.agg_filter);
	}

	auto order_bys = make_uniq<OrderModifier>();
	TransformOrderBy(root.agg_order, order_bys->orders);

	// Ordered aggregates can be either WITHIN GROUP or after the function arguments
	if (root.agg_within_group) {
		//	https://www.postgresql.org/docs/current/functions-aggregate.html#FUNCTIONS-ORDEREDSET-TABLE
		//  Since we implement "ordered aggregates" without sorting,
		//  we map all the ones we support to the corresponding aggregate function.
		if (order_bys->orders.size() != 1) {
			throw ParserException("Cannot use multiple ORDER BY clauses with WITHIN GROUP");
		}
		if (lowercase_name == "percentile_cont") {
			if (children.size() != 1) {
				throw ParserException("Wrong number of arguments for PERCENTILE_CONT");
			}
			lowercase_name = "quantile_cont";
		} else if (lowercase_name == "percentile_disc") {
			if (children.size() != 1) {
				throw ParserException("Wrong number of arguments for PERCENTILE_DISC");
			}
			lowercase_name = "quantile_disc";
		} else if (lowercase_name == "mode") {
			if (!children.empty()) {
				throw ParserException("Wrong number of arguments for MODE");
			}
			lowercase_name = "mode";
		} else {
			throw ParserException("Unknown ordered aggregate \"%s\".", function_name);
		}
	}

	// star gets eaten in the parser
	if (lowercase_name == "count" && children.empty()) {
		lowercase_name = "count_star";
	}

	if (lowercase_name == "if") {
		if (children.size() != 3) {
			throw ParserException("Wrong number of arguments to IF.");
		}
		auto expr = make_uniq<CaseExpression>();
		CaseCheck check;
		check.when_expr = std::move(children[0]);
		check.then_expr = std::move(children[1]);
		expr->case_checks.push_back(std::move(check));
		expr->else_expr = std::move(children[2]);
		return std::move(expr);
	} else if (lowercase_name == "unpack") {
		if (children.size() != 1) {
			throw ParserException("Wrong number of arguments to the UNPACK operator");
		}
		auto expr = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_UNPACK);
		expr->children = std::move(children);
		return std::move(expr);
	} else if (lowercase_name == "try") {
		if (children.size() != 1) {
			throw ParserException("Wrong number of arguments provided to TRY expression");
		}
		auto try_expression = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_TRY);
		try_expression->children = std::move(children);
		return std::move(try_expression);
	} else if (lowercase_name == "construct_array") {
		auto construct_array = make_uniq<OperatorExpression>(ExpressionType::ARRAY_CONSTRUCTOR);
		construct_array->children = std::move(children);
		return std::move(construct_array);
	} else if (lowercase_name == "__internal_position_operator") {
		if (children.size() != 2) {
			throw ParserException("Wrong number of arguments to __internal_position_operator.");
		}
		// swap arguments for POSITION(x IN y)
		std::swap(children[0], children[1]);
		lowercase_name = "position";
	} else if (lowercase_name == "ifnull") {
		if (children.size() != 2) {
			throw ParserException("Wrong number of arguments to IFNULL.");
		}

		//  Two-argument COALESCE
		auto coalesce_op = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_COALESCE);
		coalesce_op->children.push_back(std::move(children[0]));
		coalesce_op->children.push_back(std::move(children[1]));
		return std::move(coalesce_op);
	} else if (lowercase_name == "list" && order_bys->orders.size() == 1) {
		// list(expr ORDER BY expr <sense> <nulls>) => list_sort(list(expr), <sense>, <nulls>)
		if (children.size() != 1) {
			throw ParserException("Wrong number of arguments to LIST.");
		}
		auto arg_expr = children[0].get();
		auto &order_by = order_bys->orders[0];
		if (arg_expr->Equals(*order_by.expression)) {
			auto sense = make_uniq<ConstantExpression>(EnumUtil::ToChars(order_by.type));
			auto nulls = make_uniq<ConstantExpression>(EnumUtil::ToChars(order_by.null_order));
			order_bys = nullptr;
			auto unordered = make_uniq<FunctionExpression>(catalog, schema, lowercase_name.c_str(), std::move(children),
			                                               std::move(filter_expr), std::move(order_bys),
			                                               root.agg_distinct, false, root.export_state);
			lowercase_name = "list_sort";
			order_bys.reset();   // NOLINT
			filter_expr.reset(); // NOLINT
			children.clear();    // NOLINT
			root.agg_distinct = false;
			children.emplace_back(std::move(unordered));
			children.emplace_back(std::move(sense));
			children.emplace_back(std::move(nulls));
		}
	} else if (lowercase_name == "date") {
		if (children.size() != 1) {
			throw ParserException("Wrong number of arguments provided to DATE function");
		}
		return std::move(make_uniq<CastExpression>(LogicalType::DATE, std::move(children[0])));
	}

	auto function = make_uniq<FunctionExpression>(std::move(catalog), std::move(schema), lowercase_name.c_str(),
	                                              std::move(children), std::move(filter_expr), std::move(order_bys),
	                                              root.agg_distinct, false, root.export_state);
	SetQueryLocation(*function, root.location);

	return std::move(function);
}